

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  mutex *__mutex;
  string *psVar1;
  _Head_base<0UL,__IO_FILE_*,_false> __stream;
  char *pcVar2;
  int iVar3;
  LogDestination *in_RAX;
  LogDestination *pLVar4;
  pointer __p;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *this;
  long lVar5;
  _Head_base<0UL,_google::LogDestination_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  this = (__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
         &log_destinations_;
  lVar5 = 0;
  do {
    if ((this->_M_t).
        super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
        .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl ==
        (LogDestination *)0x0) {
      pLVar4 = (LogDestination *)operator_new(0xd0);
      LogDestination(pLVar4,(LogSeverity)lVar5,(char *)0x0);
      local_38._M_head_impl = (LogDestination *)0x0;
      std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      reset(this,pLVar4);
      std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                   *)&local_38);
    }
    pLVar4 = (this->_M_t).
             super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
             .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
    __mutex = &(pLVar4->fileobject_).mutex_;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    psVar1 = &(pLVar4->fileobject_).filename_extension_;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 != 0) {
      __stream._M_head_impl =
           *(_IO_FILE **)
            &(pLVar4->fileobject_).file_._M_t.
             super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
             super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>;
      if ((_Head_base<0UL,__IO_FILE_*,_false>)__stream._M_head_impl !=
          (_Head_base<0UL,__IO_FILE_*,_false>)0x0) {
        (pLVar4->fileobject_).file_._M_t.
        super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
        super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_> =
             (_Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>)0x0;
        fclose((FILE *)__stream._M_head_impl);
        (pLVar4->fileobject_).rollover_attempt_ = 0x1f;
      }
      pcVar2 = (char *)(pLVar4->fileobject_).filename_extension_._M_string_length;
      strlen(ext);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)ext);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar5 = lVar5 + 1;
    this = this + 1;
  } while (lVar5 != 4);
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  for (int severity = 0; severity < NUM_SEVERITIES; ++severity) {
    log_destination(static_cast<LogSeverity>(severity))
        ->fileobject_.SetExtension(ext);
  }
}